

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcCom.c
# Opt level: O0

int Abc_CommandRetime(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Wln_Ntk_t *pNtk_00;
  int *piVar1;
  char *pcVar2;
  Wln_Ntk_t *pNtk;
  Vec_Int_t *vMoves;
  int fVerbose;
  int fDump;
  int c;
  int fSkipSimple;
  char *pFileName;
  FILE *pFile;
  char **argv_local;
  Abc_Frame_t *pAStack_18;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  _c = (char *)0x0;
  fDump = 0;
  vMoves._4_4_ = 0;
  vMoves._0_4_ = 0;
  pFile = (FILE *)argv;
  argv_local._4_4_ = argc;
  pAStack_18 = pAbc;
  Extra_UtilGetoptReset();
LAB_003e9e17:
  fVerbose = Extra_UtilGetopt(argv_local._4_4_,(char **)pFile,"sdvh");
  if (fVerbose == -1) {
    if (pAStack_18->pNdr == (void *)0x0) {
      if (argv_local._4_4_ == globalUtilOptind + 1) {
        _c = *(char **)(&pFile->_flags + (long)globalUtilOptind * 2);
        pFileName = (char *)fopen(_c,"r");
        if ((FILE *)pFileName == (FILE *)0x0) {
          Abc_Print(1,"Cannot open input file \"%s\". ",_c);
          _c = Extra_FileGetSimilarName(_c,".ndr",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
          if (_c != (char *)0x0) {
            Abc_Print(1,"Did you mean \"%s\"?",_c);
          }
          Abc_Print(1,"\n");
        }
        else {
          fclose((FILE *)pFileName);
          Wln_NtkRetimeTest(_c,fDump,vMoves._4_4_,(uint)vMoves);
        }
      }
      else {
        printf("Abc_CommandRetime(): Input file name should be given on the command line.\n");
      }
    }
    else {
      pNtk_00 = Wln_NtkFromNdr(pAStack_18->pNdr,vMoves._4_4_);
      Wln_NtkRetimeCreateDelayInfo(pNtk_00);
      if (pNtk_00 == (Wln_Ntk_t *)0x0) {
        printf("Transforming NDR into internal represnetation has failed.\n");
      }
      else {
        pNtk = (Wln_Ntk_t *)Wln_NtkRetime(pNtk_00,fDump,(uint)vMoves);
        Wln_NtkFree(pNtk_00);
        if (pAStack_18->pNdrArray != (int *)0x0) {
          free(pAStack_18->pNdrArray);
          pAStack_18->pNdrArray = (int *)0x0;
        }
        if (pNtk != (Wln_Ntk_t *)0x0) {
          piVar1 = Vec_IntReleaseNewArray((Vec_Int_t *)pNtk);
          pAStack_18->pNdrArray = piVar1;
        }
        Vec_IntFreeP((Vec_Int_t **)&pNtk);
      }
    }
    return 0;
  }
  switch(fVerbose) {
  case 100:
    vMoves._4_4_ = vMoves._4_4_ ^ 1;
    goto LAB_003e9e17;
  default:
    break;
  case 0x68:
    break;
  case 0x73:
    fDump = fDump ^ 1;
    goto LAB_003e9e17;
  case 0x76:
    goto switchD_003e9e55_caseD_76;
  }
  Abc_Print(-2,"usage: %%retime [-sdvh]\n");
  Abc_Print(-2,"\t         performs retiming for the NDR design\n");
  pcVar2 = "no";
  if (fDump == 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-s     : toggle printing simple nodes [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if (vMoves._4_4_ != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-d     : toggle dumping the network in Verilog [default = %s]\n",pcVar2);
  pcVar2 = "no";
  if ((uint)vMoves != 0) {
    pcVar2 = "yes";
  }
  Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar2);
  Abc_Print(-2,"\t-h     : print the command usage\n");
  return 1;
switchD_003e9e55_caseD_76:
  vMoves._0_4_ = (uint)vMoves ^ 1;
  goto LAB_003e9e17;
}

Assistant:

int Abc_CommandRetime( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Wln_NtkRetimeTest( char * pFileName, int fSkipSimple, int fDump, int fVerbose );
    FILE * pFile;
    char * pFileName = NULL;
    int fSkipSimple  = 0;
    int c, fDump = 0, fVerbose  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "sdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 's':
            fSkipSimple ^= 1;
            break;
        case 'd':
            fDump ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pNdr )
    {
        Vec_Int_t * vMoves;
        Wln_Ntk_t * pNtk = Wln_NtkFromNdr( pAbc->pNdr, fDump );
        Wln_NtkRetimeCreateDelayInfo( pNtk );
        if ( pNtk == NULL )
        {
            printf( "Transforming NDR into internal represnetation has failed.\n" );
            return 0;
        }
        vMoves = Wln_NtkRetime( pNtk, fSkipSimple, fVerbose );
        Wln_NtkFree( pNtk );
        ABC_FREE( pAbc->pNdrArray );
        if ( vMoves ) pAbc->pNdrArray = Vec_IntReleaseNewArray( vMoves );
        Vec_IntFreeP( &vMoves );
        return 0;
    }
    if ( argc != globalUtilOptind + 1 )
    {
        printf( "Abc_CommandRetime(): Input file name should be given on the command line.\n" );
        return 0;
    }
    // get the file name
    pFileName = argv[globalUtilOptind];
    if ( (pFile = fopen( pFileName, "r" )) == NULL )
    {
        Abc_Print( 1, "Cannot open input file \"%s\". ", pFileName );
        if ( (pFileName = Extra_FileGetSimilarName( pFileName, ".ndr", NULL, NULL, NULL, NULL )) )
            Abc_Print( 1, "Did you mean \"%s\"?", pFileName );
        Abc_Print( 1, "\n" );
        return 0;
    }
    fclose( pFile );
    Wln_NtkRetimeTest( pFileName, fSkipSimple, fDump, fVerbose );
    return 0;
usage:
    Abc_Print( -2, "usage: %%retime [-sdvh]\n" );
    Abc_Print( -2, "\t         performs retiming for the NDR design\n" );
    Abc_Print( -2, "\t-s     : toggle printing simple nodes [default = %s]\n", !fSkipSimple? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle dumping the network in Verilog [default = %s]\n", fDump? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}